

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_aggregate.cpp
# Opt level: O1

SinkResultType __thiscall
duckdb::PhysicalHashAggregate::Sink
          (PhysicalHashAggregate *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSinkInput *input)

{
  _Atomic_word *p_Var1;
  GlobalSinkState *pGVar2;
  LocalSinkState *pLVar3;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar4;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar5;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var6;
  ulong uVar7;
  __node_base_ptr p_Var8;
  int iVar9;
  DataChunk *this_00;
  pointer pEVar10;
  BoundAggregateExpression *pBVar11;
  BoundReferenceExpression *pBVar12;
  reference pvVar13;
  reference pvVar14;
  __node_base_ptr p_Var15;
  reference this_01;
  reference this_02;
  const_reference this_03;
  ulong uVar16;
  _Hash_node_base *p_Var17;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar18;
  __node_base_ptr p_Var19;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *aggregate_1;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *child_expr;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_04;
  size_type __n;
  size_type __n_00;
  size_type sVar20;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *aggregate;
  OperatorSinkInput sink_input;
  InterruptState interrupt_state;
  OperatorSinkInput local_70;
  InterruptState local_58;
  
  pGVar2 = input->global_state;
  pLVar3 = input->local_state;
  if ((this->distinct_collection_info).
      super_unique_ptr<duckdb::DistinctAggregateCollectionInfo,_std::default_delete<duckdb::DistinctAggregateCollectionInfo>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::DistinctAggregateCollectionInfo,_std::default_delete<duckdb::DistinctAggregateCollectionInfo>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::DistinctAggregateCollectionInfo_*,_std::default_delete<duckdb::DistinctAggregateCollectionInfo>_>
      .super__Head_base<0UL,_duckdb::DistinctAggregateCollectionInfo_*,_false>._M_head_impl !=
      (DistinctAggregateCollectionInfo *)0x0) {
    SinkDistinct(this,context,chunk,input);
  }
  if ((((this->filter_indexes)._M_h._M_element_count != 0) ||
      ((this->grouped_aggregate_data).aggregates.
       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (this->grouped_aggregate_data).aggregates.
       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)) ||
     ((this->non_distinct_filter).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->non_distinct_filter).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    this_00 = (DataChunk *)(pLVar3 + 1);
    puVar4 = (this->grouped_aggregate_data).aggregates.
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    __n_00 = 0;
    for (puVar18 = (this->grouped_aggregate_data).aggregates.
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar18 != puVar4;
        puVar18 = puVar18 + 1) {
      pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(puVar18);
      pBVar11 = BaseExpression::Cast<duckdb::BoundAggregateExpression>
                          (&pEVar10->super_BaseExpression);
      puVar5 = (pBVar11->children).
               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (this_04 = (pBVar11->children).
                     super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; this_04 != puVar5;
          this_04 = this_04 + 1) {
        pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(this_04);
        pBVar12 = BaseExpression::Cast<duckdb::BoundReferenceExpression>
                            (&pEVar10->super_BaseExpression);
        pvVar13 = vector<duckdb::Vector,_true>::operator[]
                            ((vector<duckdb::Vector,_true> *)this_00,__n_00);
        pvVar14 = vector<duckdb::Vector,_true>::operator[](&chunk->data,pBVar12->index);
        Vector::Reference(pvVar13,pvVar14);
        __n_00 = __n_00 + 1;
      }
    }
    puVar4 = (this->grouped_aggregate_data).aggregates.
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar18 = (this->grouped_aggregate_data).aggregates.
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar18 != puVar4;
        puVar18 = puVar18 + 1) {
      pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(puVar18);
      pBVar11 = BaseExpression::Cast<duckdb::BoundAggregateExpression>
                          (&pEVar10->super_BaseExpression);
      _Var6._M_head_impl =
           (pBVar11->filter).
           super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
           super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      sVar20 = __n_00;
      if (_Var6._M_head_impl != (Expression *)0x0) {
        uVar7 = (this->filter_indexes)._M_h._M_bucket_count;
        uVar16 = (ulong)_Var6._M_head_impl % uVar7;
        p_Var8 = (this->filter_indexes)._M_h._M_buckets[uVar16];
        p_Var15 = (__node_base_ptr)0x0;
        if ((p_Var8 != (__node_base_ptr)0x0) &&
           (p_Var15 = p_Var8, p_Var19 = p_Var8->_M_nxt,
           _Var6._M_head_impl != (Expression *)p_Var8->_M_nxt[1]._M_nxt)) {
          while (p_Var17 = p_Var19->_M_nxt, p_Var17 != (_Hash_node_base *)0x0) {
            p_Var15 = (__node_base_ptr)0x0;
            if (((ulong)p_Var17[1]._M_nxt % uVar7 != uVar16) ||
               (p_Var15 = p_Var19, p_Var19 = p_Var17,
               _Var6._M_head_impl == (Expression *)p_Var17[1]._M_nxt)) goto LAB_01662d1b;
          }
          p_Var15 = (__node_base_ptr)0x0;
        }
LAB_01662d1b:
        if (p_Var15 == (__node_base_ptr)0x0) {
          p_Var17 = (_Hash_node_base *)0x0;
        }
        else {
          p_Var17 = p_Var15->_M_nxt;
        }
        sVar20 = __n_00 + 1;
        pvVar13 = vector<duckdb::Vector,_true>::operator[]
                            ((vector<duckdb::Vector,_true> *)this_00,__n_00);
        pvVar14 = vector<duckdb::Vector,_true>::operator[]
                            (&chunk->data,(size_type)p_Var17[2]._M_nxt);
        Vector::Reference(pvVar13,pvVar14);
      }
      __n_00 = sVar20;
    }
    pLVar3[1].partition_info.partition_data.
    super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
    super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)chunk->count;
    DataChunk::Verify(this_00);
    if ((this->groupings).
        super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
        .
        super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->groupings).
        super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
        .
        super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      __n = 0;
      do {
        this_01 = vector<duckdb::HashAggregateGroupingGlobalState,_true>::operator[]
                            ((vector<duckdb::HashAggregateGroupingGlobalState,_true> *)(pGVar2 + 1),
                             __n);
        this_02 = vector<duckdb::HashAggregateGroupingLocalState,_true>::operator[]
                            ((vector<duckdb::HashAggregateGroupingLocalState,_true> *)
                             &pLVar3[2].partition_info.min_batch_index,__n);
        InterruptState::InterruptState(&local_58);
        local_70.global_state =
             unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
             ::operator*(&this_01->table_state);
        local_70.local_state =
             unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>::
             operator*(&this_02->table_state);
        local_70.interrupt_state = &local_58;
        this_03 = vector<duckdb::HashAggregateGroupingData,_true>::operator[](&this->groupings,__n);
        RadixPartitionedHashTable::Sink
                  (&this_03->table_data,context,chunk,&local_70,this_00,&this->non_distinct_filter);
        if (local_58.signal_state.internal.
            super___weak_ptr<duckdb::InterruptDoneSignalState,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var1 = &(local_58.signal_state.internal.
                       super___weak_ptr<duckdb::InterruptDoneSignalState,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi)->_M_weak_count;
            iVar9 = *p_Var1;
            *p_Var1 = *p_Var1 + -1;
            UNLOCK();
          }
          else {
            iVar9 = (local_58.signal_state.internal.
                     super___weak_ptr<duckdb::InterruptDoneSignalState,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_weak_count;
            (local_58.signal_state.internal.
             super___weak_ptr<duckdb::InterruptDoneSignalState,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_weak_count = iVar9 + -1;
          }
          if (iVar9 == 1) {
            (*(local_58.signal_state.internal.
               super___weak_ptr<duckdb::InterruptDoneSignalState,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
          }
        }
        if (local_58.current_task.internal.
            super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var1 = &(local_58.current_task.internal.
                       super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                      ->_M_weak_count;
            iVar9 = *p_Var1;
            *p_Var1 = *p_Var1 + -1;
            UNLOCK();
          }
          else {
            iVar9 = (local_58.current_task.internal.
                     super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                    _M_weak_count;
            (local_58.current_task.internal.
             super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_weak_count = iVar9 + -1;
          }
          if (iVar9 == 1) {
            (*(local_58.current_task.internal.
               super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _vptr__Sp_counted_base[3])();
          }
        }
        __n = __n + 1;
      } while (__n < (ulong)(((long)(this->groupings).
                                    super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                                    .
                                    super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->groupings).
                                    super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                                    .
                                    super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4) *
                            0x6db6db6db6db6db7));
    }
  }
  return NEED_MORE_INPUT;
}

Assistant:

SinkResultType PhysicalHashAggregate::Sink(ExecutionContext &context, DataChunk &chunk,
                                           OperatorSinkInput &input) const {
	auto &local_state = input.local_state.Cast<HashAggregateLocalSinkState>();
	auto &global_state = input.global_state.Cast<HashAggregateGlobalSinkState>();

	if (distinct_collection_info) {
		SinkDistinct(context, chunk, input);
	}

	if (CanSkipRegularSink()) {
		return SinkResultType::NEED_MORE_INPUT;
	}

	DataChunk &aggregate_input_chunk = local_state.aggregate_input_chunk;
	auto &aggregates = grouped_aggregate_data.aggregates;
	idx_t aggregate_input_idx = 0;

	// Populate the aggregate child vectors
	for (auto &aggregate : aggregates) {
		auto &aggr = aggregate->Cast<BoundAggregateExpression>();
		for (auto &child_expr : aggr.children) {
			D_ASSERT(child_expr->GetExpressionType() == ExpressionType::BOUND_REF);
			auto &bound_ref_expr = child_expr->Cast<BoundReferenceExpression>();
			D_ASSERT(bound_ref_expr.index < chunk.data.size());
			aggregate_input_chunk.data[aggregate_input_idx++].Reference(chunk.data[bound_ref_expr.index]);
		}
	}
	// Populate the filter vectors
	for (auto &aggregate : aggregates) {
		auto &aggr = aggregate->Cast<BoundAggregateExpression>();
		if (aggr.filter) {
			auto it = filter_indexes.find(aggr.filter.get());
			D_ASSERT(it != filter_indexes.end());
			D_ASSERT(it->second < chunk.data.size());
			aggregate_input_chunk.data[aggregate_input_idx++].Reference(chunk.data[it->second]);
		}
	}

	aggregate_input_chunk.SetCardinality(chunk.size());
	aggregate_input_chunk.Verify();

	// For every grouping set there is one radix_table
	for (idx_t i = 0; i < groupings.size(); i++) {
		auto &grouping_global_state = global_state.grouping_states[i];
		auto &grouping_local_state = local_state.grouping_states[i];
		InterruptState interrupt_state;
		OperatorSinkInput sink_input {*grouping_global_state.table_state, *grouping_local_state.table_state,
		                              interrupt_state};

		auto &grouping = groupings[i];
		auto &table = grouping.table_data;
		table.Sink(context, chunk, sink_input, aggregate_input_chunk, non_distinct_filter);
	}

	return SinkResultType::NEED_MORE_INPUT;
}